

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processPriorityCommand(CommonCore *this)

{
  ActionMessage *in_RSI;
  
  processPriorityCommand((CommonCore *)&this[-1].initIterations,in_RSI);
  return;
}

Assistant:

void CommonCore::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_REG_FED: {
            // this one in the core needs to be the thread-safe version of getFederate
            auto insertRes =
                loopFederates.insert(command.name(), no_search, getFederate(command.name()));
            if (!insertRes && checkActionFlag(command, reentrant_flag)) {
                auto lfed = loopFederates.find(command.name());
                lfed->state = OperatingState::OPERATING;
            }

            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }

        } break;
        case CMD_BROKER_LOCATION: {
            command.setAction(CMD_PROTOCOL);
            command.messageID = NEW_BROKER_INFORMATION;
            transmit(control_route, std::move(command));
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        } break;
        case CMD_REG_BROKER:
            // These really shouldn't happen here probably means something went wrong in setup but
            // we can handle it forward the connection request to the higher level
            if (command.name() == identifier) {
                LOG_ERROR(
                    global_broker_id_local,
                    identifier,
                    "received locally sent registration message, broker loop, please set the broker address to "
                    "a valid broker");
            } else {
                LOG_WARNING(parent_broker_id,
                            identifier,
                            "Core received reg broker message, likely improper federation setup\n");
                transmit(parent_route_id, command);
            }
            break;
        case CMD_BROKER_ACK:
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    auto estring =
                        std::string("broker responded with error: ") + errorMessageString(command);
                    setErrorState(command.messageID, estring);
                    errorRespondDelayedMessages(estring);
                    LOG_ERROR(parent_broker_id, identifier, estring);
                    break;
                }
                global_id = GlobalBrokerId{command.dest_id};
                global_broker_id_local = GlobalBrokerId{command.dest_id};
                filterFedID = getSpecialFederateId(global_broker_id_local, 0);
                translatorFedID = getSpecialFederateId(global_broker_id_local, 1);
                timeCoord->setSourceId(global_broker_id_local);

                higher_broker_id = GlobalBrokerId{command.source_id};
                transmitDelayedMessages();
                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                timeoutMon->reset();
                if (delayInitCounter < 0 && minFederateCount == 0 && minChildCount == 0) {
                    if (allInitReady()) {
                        if (transitionBrokerState(BrokerState::CONNECTED,
                                                  BrokerState::INITIALIZING)) {
                            // make sure we only do this once
                            ActionMessage init(CMD_INIT);
                            if (initIterations.load()) {
                                setActionFlag(init, iteration_requested_flag);
                            }
                            checkDependencies();
                            init.source_id = global_broker_id_local;
                            init.dest_id = parent_broker_id;
                            transmit(parent_route_id, init);
                        }
                    }
                }
            }
            break;
        case CMD_FED_ACK: {
            FederateState* fed{nullptr};
            fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (checkActionFlag(command, error_flag)) {
                    LOG_ERROR(
                        parent_broker_id,
                        identifier,
                        fmt::format("broker responded with error for registration of {}::{}\n",
                                    command.name(),
                                    commandErrorString(command.messageID)));
                } else {
                    fed->global_id = command.dest_id;
                    loopFederates.addSearchTerm(command.dest_id, command.name());
                    if (!keyFed.isValid()) {
                        keyFed = fed->global_id;
                    }
                }

                // push the command to the local queue
                fed->addAction(std::move(command));
            }
        } break;
        case CMD_REG_ROUTE:
            // TODO(PT): double check this
            addRoute(route_id(command.getExtraData()), 0, command.payload.to_string());
            break;
        case CMD_PRIORITY_DISCONNECT:
            checkAndProcessDisconnect();
            break;
        case CMD_SEND_COMMAND:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
            processQueryCommand(command);
            break;
        case CMD_PRIORITY_ACK:
        case CMD_ROUTE_ACK:
            break;
        case CMD_SET_GLOBAL:
            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }
            break;
        default: {
            if (!isPriorityCommand(command)) {
                processCommand(std::move(command));
            }
        }
    }
}